

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::cmMakefileTargetGenerator
          (cmMakefileTargetGenerator *this,cmGeneratorTarget *target)

{
  bool bVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  cmGlobalUnixMakefileGenerator3 *pcVar3;
  cmState *this_00;
  char *val;
  MacOSXContentGeneratorType *this_01;
  allocator local_59;
  string local_58;
  char *local_38;
  char *ruleStatus;
  cmake *cm;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *target_local;
  cmMakefileTargetGenerator *this_local;
  
  local_18 = target;
  target_local = (cmGeneratorTarget *)this;
  cmCommonTargetGenerator::cmCommonTargetGenerator(&this->super_cmCommonTargetGenerator,target);
  (this->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator =
       (_func_int **)&PTR__cmMakefileTargetGenerator_00bc63e0;
  std::__cxx11::string::string((string *)&this->BuildFileName);
  std::__cxx11::string::string((string *)&this->BuildFileNameFull);
  std::__cxx11::string::string((string *)&this->ProgressFileNameFull);
  std::__cxx11::string::string((string *)&this->TargetBuildDirectory);
  std::__cxx11::string::string((string *)&this->TargetBuildDirectoryFull);
  std::__cxx11::string::string((string *)&this->FlagFileNameFull);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList>_>_>
  ::map(&this->FlagFileDepends);
  std::__cxx11::string::string((string *)&this->InfoFileNameFull);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->CleanFiles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Objects);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ExternalObjects);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ObjectFiles);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ExtraFiles);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->MultipleOutputPairs);
  std::__cxx11::string::string((string *)&this->TargetNameOut);
  std::__cxx11::string::string((string *)&this->TargetNameSO);
  std::__cxx11::string::string((string *)&this->TargetNameReal);
  std::__cxx11::string::string((string *)&this->TargetNameImport);
  std::__cxx11::string::string((string *)&this->TargetNamePDB);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->MacContentFolders);
  this->OSXBundleGenerator = (cmOSXBundleGenerator *)0x0;
  this->MacOSXContentGenerator = (MacOSXContentGeneratorType *)0x0;
  this->BuildFileStream = (cmGeneratedFileStream *)0x0;
  this->InfoFileStream = (cmGeneratedFileStream *)0x0;
  this->FlagFileStream = (cmGeneratedFileStream *)0x0;
  this->CustomCommandDriver = OnBuild;
  pcVar2 = (cmLocalUnixMakefileGenerator3 *)cmGeneratorTarget::GetLocalGenerator(local_18);
  this->LocalGenerator = pcVar2;
  pcVar3 = (cmGlobalUnixMakefileGenerator3 *)
           cmLocalGenerator::GetGlobalGenerator((cmLocalGenerator *)this->LocalGenerator);
  this->GlobalGenerator = pcVar3;
  ruleStatus = (char *)cmGlobalGenerator::GetCMakeInstance
                                 ((cmGlobalGenerator *)this->GlobalGenerator);
  this->NoRuleMessages = false;
  this_00 = cmake::GetState((cmake *)ruleStatus);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"RULE_MESSAGES",&local_59);
  val = cmState::GetGlobalProperty(this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_38 = val;
  if (val != (char *)0x0) {
    bVar1 = cmSystemTools::IsOff(val);
    this->NoRuleMessages = bVar1;
  }
  this_01 = (MacOSXContentGeneratorType *)operator_new(0x10);
  MacOSXContentGeneratorType::MacOSXContentGeneratorType(this_01,this);
  this->MacOSXContentGenerator = this_01;
  return;
}

Assistant:

cmMakefileTargetGenerator::cmMakefileTargetGenerator(cmGeneratorTarget* target)
  : cmCommonTargetGenerator(target)
  , OSXBundleGenerator(CM_NULLPTR)
  , MacOSXContentGenerator(CM_NULLPTR)
{
  this->BuildFileStream = CM_NULLPTR;
  this->InfoFileStream = CM_NULLPTR;
  this->FlagFileStream = CM_NULLPTR;
  this->CustomCommandDriver = OnBuild;
  this->LocalGenerator =
    static_cast<cmLocalUnixMakefileGenerator3*>(target->GetLocalGenerator());
  this->GlobalGenerator = static_cast<cmGlobalUnixMakefileGenerator3*>(
    this->LocalGenerator->GetGlobalGenerator());
  cmake* cm = this->GlobalGenerator->GetCMakeInstance();
  this->NoRuleMessages = false;
  if (const char* ruleStatus =
        cm->GetState()->GetGlobalProperty("RULE_MESSAGES")) {
    this->NoRuleMessages = cmSystemTools::IsOff(ruleStatus);
  }
  MacOSXContentGenerator = new MacOSXContentGeneratorType(this);
}